

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.h
# Opt level: O0

void __thiscall
muduo::detail::FixedBuffer<4000000>::append(FixedBuffer<4000000> *this,char *buf,size_t len)

{
  unsigned_long uVar1;
  ulong in_RDX;
  void *in_RSI;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  
  avail((FixedBuffer<4000000> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  uVar1 = implicit_cast<unsigned_long,int>((int *)&stack0xffffffffffffffe4);
  if (in_RDX < uVar1) {
    memcpy(*(void **)(in_RDI + 0x3d0908),in_RSI,in_RDX);
    *(ulong *)(in_RDI + 0x3d0908) = in_RDX + *(long *)(in_RDI + 0x3d0908);
  }
  return;
}

Assistant:

void append(const char* /*restrict*/ buf, size_t len)
  {
    // FIXME: append partially
    if (implicit_cast<size_t>(avail()) > len)
    {
      memcpy(cur_, buf, len);
      cur_ += len;
    }
  }